

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O3

Ref<embree::XML> __thiscall embree::XML::child(XML *this,string *childID)

{
  pointer pcVar1;
  pointer __s2;
  _func_int *__n;
  _func_int **pp_Var2;
  int iVar3;
  runtime_error *this_00;
  long *plVar4;
  size_type *psVar5;
  long *plVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long lVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = childID[4]._M_dataplus._M_p;
  lVar8 = childID[4]._M_string_length - (long)pcVar1;
  if (lVar8 != 0) {
    lVar8 = lVar8 >> 3;
    __s2 = (in_RDX->_M_dataplus)._M_p;
    __n = (_func_int *)in_RDX->_M_string_length;
    lVar7 = 0;
    do {
      pp_Var2 = *(_func_int ***)(pcVar1 + lVar7 * 8);
      if (pp_Var2[7] == __n) {
        if (__n == (_func_int *)0x0) {
LAB_001914a7:
          (this->super_RefCount)._vptr_RefCount = pp_Var2;
          (**(code **)(*pp_Var2 + 0x10))(pp_Var2);
          return (Ref<embree::XML>)this;
        }
        iVar3 = bcmp(pp_Var2[6],__s2,(size_t)__n);
        if (iVar3 == 0) goto LAB_001914a7;
      }
      lVar7 = lVar7 + 1;
    } while (lVar8 + (ulong)(lVar8 == 0) != lVar7);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_70,(ParseLocation *)&childID->field_2);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_b0._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar5) {
    local_b0.field_2._M_allocated_capacity = *psVar5;
    local_b0.field_2._8_8_ = plVar4[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar5;
  }
  local_b0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::operator+(&local_50,&local_b0,in_RDX);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_90 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar6;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_90);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Ref<XML> child(const std::string& childID) const 
    {
      for (size_t i=0; i<children.size(); i++)
        if (children[i]->name == childID) return children[i];
      THROW_RUNTIME_ERROR (loc.str()+": XML node has no child \"" + childID + "\"");
    }